

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aarect.h
# Opt level: O2

bool __thiscall yz_rect::hit(yz_rect *this,ray *r,double t0,double t1,hit_record *rec)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  double dVar4;
  double dVar7;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double t;
  vec3 outward_normal;
  vec3 local_48;
  vec3 local_30;
  
  t = (this->k - (r->orig).e[0]) / (r->dir).e[0];
  bVar3 = false;
  if ((t0 <= t) && (t <= t1)) {
    dVar4 = t * (r->dir).e[1] + (r->orig).e[1];
    dVar7 = t * (r->dir).e[2] + (r->orig).e[2];
    dVar1 = this->y0;
    if ((dVar4 < dVar1) ||
       (((this->y1 < dVar4 || (dVar2 = this->z0, dVar7 < dVar2)) || (this->z1 < dVar7)))) {
      bVar3 = false;
    }
    else {
      auVar5._0_8_ = dVar4 - dVar1;
      auVar5._8_8_ = dVar7 - dVar2;
      auVar6._8_8_ = this->z1 - dVar2;
      auVar6._0_8_ = this->y1 - dVar1;
      auVar6 = divpd(auVar5,auVar6);
      rec->u = (double)auVar6._0_8_;
      rec->v = (double)auVar6._8_8_;
      rec->t = t;
      local_30.e[0] = 1.0;
      local_30.e[1] = 0.0;
      local_30.e[2] = 0.0;
      hit_record::set_face_normal(rec,r,&local_30);
      std::__shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(rec->mat_ptr).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>,
                 &(this->mp).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>);
      ray::at(&local_48,r,t);
      (rec->p).e[2] = local_48.e[2];
      (rec->p).e[0] = local_48.e[0];
      (rec->p).e[1] = local_48.e[1];
      bVar3 = true;
    }
  }
  return bVar3;
}

Assistant:

bool yz_rect::hit(const ray& r, double t0, double t1, hit_record& rec) const {
    auto t = (k-r.origin().x()) / r.direction().x();
    if (t < t0 || t > t1)
        return false;
    auto y = r.origin().y() + t*r.direction().y();
    auto z = r.origin().z() + t*r.direction().z();
    if (y < y0 || y > y1 || z < z0 || z > z1)
        return false;
    rec.u = (y-y0)/(y1-y0);
    rec.v = (z-z0)/(z1-z0);
    rec.t = t;
    vec3 outward_normal = vec3(1, 0, 0);
    rec.set_face_normal(r, outward_normal);
    rec.mat_ptr = mp;
    rec.p = r.at(t);
    return true;
}